

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix3f.cpp
# Opt level: O0

Matrix3f * operator*(Matrix3f *__return_storage_ptr__,Matrix3f *m,float f)

{
  float *pfVar1;
  undefined4 local_24;
  undefined4 local_20;
  int j;
  int i;
  float f_local;
  Matrix3f *m_local;
  Matrix3f *product;
  
  Matrix3f::Matrix3f(__return_storage_ptr__,m);
  for (local_20 = 0; local_20 < 3; local_20 = local_20 + 1) {
    for (local_24 = 0; local_24 < 3; local_24 = local_24 + 1) {
      pfVar1 = Matrix3f::operator()(__return_storage_ptr__,local_20,local_24);
      *pfVar1 = f * *pfVar1;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Matrix3f operator * (const Matrix3f& m, float f) {
    Matrix3f product(m); // zeroes

    for (int i = 0; i < 3; ++i)
    {
        for (int j = 0; j < 3; ++j)
        {
            product(i, j) *= f;
        }
    }
    return product;
}